

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O0

void __thiscall
absl::base_internal::AtomicHook<bool_(*)(absl::LogSeverity,_const_char_*,_int,_char_**,_int_*)>::
Store(AtomicHook<bool_(*)(absl::LogSeverity,_const_char_*,_int,_char_**,_int_*)> *this,FnPtr fn)

{
  bool bVar1;
  bool success;
  FnPtr fn_local;
  AtomicHook<bool_(*)(absl::LogSeverity,_const_char_*,_int,_char_**,_int_*)> *this_local;
  
  bVar1 = DoStore(this,fn);
  if (bVar1) {
    return;
  }
  __assert_fail("success",
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/base/internal/atomic_hook.h"
                ,0x6e,
                "void absl::base_internal::AtomicHook<bool (*)(absl::LogSeverity, const char *, int, char **, int *)>::Store(FnPtr) [T = bool (*)(absl::LogSeverity, const char *, int, char **, int *)]"
               );
}

Assistant:

void Store(FnPtr fn) {
    bool success = DoStore(fn);
    static_cast<void>(success);
    assert(success);
  }